

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dataFloat(Forth *this,FCell x)

{
  CAddr pointer;
  FCell local_18;
  FCell x_local;
  Forth *this_local;
  
  local_18 = x;
  x_local = (FCell)this;
  checkValidHere(this,"F,");
  requireDataSpaceAvailable(this,(long)this->FCellSize,"F,");
  pointer = getDataPointer(this);
  setDataCell(this,pointer,&local_18);
  incDataPointer(this,this->FCellSize);
  return;
}

Assistant:

void dataFloat(FCell x) {
			REQUIRE_VALID_HERE("F,");
			REQUIRE_DATASPACE_AVAILABLE(FCellSize, "F,");
			REQUIRE_ALIGNED(getDataPointer(), "F,");
			setDataCell((AADDR(getDataPointer())), x);
			incDataPointer(FCellSize);
		}